

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall
Renderer::renderLighting
          (Renderer *this,vector<Light_*,_std::allocator<Light_*>_> *lights,Shader *shader)

{
  GLuint GVar1;
  Light *pLVar2;
  PFNGLGETUNIFORMLOCATIONPROC p_Var3;
  PFNGLUNIFORM1FPROC p_Var4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORM3FPROC p_Var6;
  GLint GVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  stringstream local_230 [8];
  stringstream indexString;
  ostream local_220 [112];
  ios_base local_1b0 [264];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  ulong local_88;
  Shader *local_80;
  vector<Light_*,_std::allocator<Light_*>_> *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  p_Var5 = __glewUniform1i;
  local_80 = shader;
  GVar7 = (*__glewGetUniformLocation)(shader->programId,"numLights");
  (*p_Var5)(GVar7,(GLint)((ulong)((long)(lights->
                                        super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(lights->
                                       super__Vector_base<Light_*,_std::allocator<Light_*>_>).
                                       _M_impl.super__Vector_impl_data._M_start) >> 3));
  if ((lights->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (lights->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    local_78 = lights;
    do {
      std::__cxx11::stringstream::stringstream(local_230);
      local_88 = uVar10;
      std::ostream::operator<<(local_220,(int)uVar10);
      p_Var6 = __glewUniform3f;
      p_Var3 = __glewGetUniformLocation;
      GVar1 = local_80->programId;
      std::__cxx11::stringbuf::str();
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x18817f);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar8;
      }
      local_68 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = &local_40;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_40 = *plVar9;
        uStack_38 = (undefined4)plVar8[3];
        uStack_34 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_40 = *plVar9;
        local_50 = (long *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      GVar7 = (*p_Var3)(GVar1,(GLchar *)local_50);
      pLVar2 = (local_78->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
               super__Vector_impl_data._M_start[local_88];
      (*p_Var6)(GVar7,(pLVar2->position).field_0.field_0.x,(pLVar2->position).field_0.field_0.y,
                (pLVar2->position).field_0.field_0.z);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      p_Var6 = __glewUniform3f;
      p_Var3 = __glewGetUniformLocation;
      GVar1 = local_80->programId;
      std::__cxx11::stringbuf::str();
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x18817f);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar8;
      }
      local_68 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = &local_40;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_40 = *plVar9;
        uStack_38 = (undefined4)plVar8[3];
        uStack_34 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_40 = *plVar9;
        local_50 = (long *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      GVar7 = (*p_Var3)(GVar1,(GLchar *)local_50);
      pLVar2 = (local_78->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
               super__Vector_impl_data._M_start[local_88];
      (*p_Var6)(GVar7,(pLVar2->color).field_0.field_0.x,(pLVar2->color).field_0.field_0.y,
                (pLVar2->color).field_0.field_0.z);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      p_Var4 = __glewUniform1f;
      p_Var3 = __glewGetUniformLocation;
      GVar1 = local_80->programId;
      std::__cxx11::stringbuf::str();
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x18817f);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar8;
      }
      local_68 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = &local_40;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_40 = *plVar9;
        uStack_38 = (undefined4)plVar8[3];
        uStack_34 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_40 = *plVar9;
        local_50 = (long *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      GVar7 = (*p_Var3)(GVar1,(GLchar *)local_50);
      uVar10 = local_88;
      (*p_Var4)(GVar7,(local_78->super__Vector_base<Light_*,_std::allocator<Light_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[local_88]->brightness);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      std::__cxx11::stringstream::~stringstream(local_230);
      std::ios_base::~ios_base(local_1b0);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(local_78->super__Vector_base<Light_*,_std::allocator<Light_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_78->super__Vector_base<Light_*,_std::allocator<Light_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void Renderer::renderLighting(std::vector<Light*> lights, Shader* shader)
{
	glUniform1i(glGetUniformLocation(shader->getProgramId(), "numLights"), lights.size());

	for (int i = 0; i < lights.size(); i++)
	{
		std::stringstream indexString;
		indexString << i;
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].position").c_str()), lights[i]->position.x, lights[i]->position.y, lights[i]->position.z);
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].color").c_str()), lights[i]->color.x, lights[i]->color.y, lights[i]->color.z);
		glUniform1f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].brightness").c_str()), lights[i]->brightness);
	}
}